

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserClass.cc
# Opt level: O3

void __thiscall ParserClass::readInput(ParserClass *this)

{
  bool bVar1;
  string *psVar2;
  char cVar3;
  int iVar4;
  _Alloc_hider _Var5;
  string nextLine;
  int theNum;
  string line;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [20];
  int local_ec;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  string *local_c8;
  string *local_c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8 = local_d8;
  local_e0 = 0;
  local_d8[0] = 0;
  local_110 = local_100;
  local_108 = 0;
  local_100[0] = 0;
  cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_e8,cVar3);
  local_b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->inputs).cond_vars;
  local_c0 = (string *)&(this->inputs).having_conds;
  local_c8 = (string *)&(this->inputs).group_var;
  bVar1 = false;
  do {
    cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_e8,cVar3);
    iVar4 = std::__cxx11::string::compare((char *)&local_e8);
    if (iVar4 == 0) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_110,cVar3);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_110,local_110 + local_108)
      ;
      setSelectVar(this,&local_70);
      psVar2 = &local_70;
      _Var5._M_p = local_70._M_dataplus._M_p;
LAB_00104003:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != &psVar2->field_2) {
        operator_delete(_Var5._M_p);
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_e8);
      if (iVar4 == 0) {
        std::istream::operator>>((istream *)&std::cin,&local_ec);
        (this->inputs).num = local_ec;
        cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)&local_e8,cVar3);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_e8);
        if (iVar4 == 0) {
          cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)&local_110,cVar3);
          std::__cxx11::string::_M_assign(local_c8);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_e8);
          if (iVar4 == 0) {
            cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)&local_110,cVar3);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,local_110,local_110 + local_108);
            setAggFunc(this,&local_90);
            psVar2 = &local_90;
            _Var5._M_p = local_90._M_dataplus._M_p;
            goto LAB_00104003;
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_e8);
          if (iVar4 == 0) {
            do {
              iVar4 = std::__cxx11::string::compare((char *)&local_110);
              if (iVar4 == 0) {
                cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&std::cin,(string *)&local_110,cVar3);
                if (local_110[local_108 + -1] == ';') {
                  std::__cxx11::string::pop_back();
                  bVar1 = true;
                }
                local_b0[0] = local_a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_b0,local_110,local_110 + local_108);
                std::__cxx11::string::_M_assign(local_c0);
                if (local_b0[0] != local_a0) {
                  operator_delete(local_b0[0]);
                }
                if (bVar1) break;
              }
              else {
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,local_110,local_110 + local_108);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string&>(local_b8,&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
              }
              cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&std::cin,(string *)&local_110,cVar3);
            } while( true );
          }
        }
      }
    }
    if (bVar1) {
      if (local_110 != local_100) {
        operator_delete(local_110);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      return;
    }
  } while( true );
}

Assistant:

void ParserClass::readInput()
{
    std::string line;
    std::string nextLine;
    getline(std::cin, line);
    bool flag = false;
    while(true)
    {
        if (flag)
            break;
        getline(std::cin, line);
        if (line == ParserClass::SELECT_VAR)
        {
            getline(std::cin, nextLine);
            this->setSelectVar(nextLine);
        }
        else if (line == ParserClass::NUM_OF_GROUPING)
        {
            int theNum;
            std::cin >> theNum;
            this->inputs.num = theNum;
            getline(std::cin, line);
        }
        else if (line == ParserClass::GROUPING_ATTRIBUTE)
        {
            getline(std::cin, nextLine);
            this->inputs.group_var = nextLine;
        }
        else if (line == ParserClass::AGG_FUNCS)
        {
            getline(std::cin, nextLine);
            this->setAggFunc(nextLine);
        }
        else if (line == ParserClass::SELECT_CONDS)
        {
            /*
             * The number of lines in SELECT CONDITION-VECT([σ]) is unknown.
             * So we parse SELECT COND and HAVING COND together. 
             */
            do
            {
                if (nextLine != ParserClass::HAVING_CONDS)
                    this->setSelectCond(nextLine);
                else
                {
                    getline(std::cin, nextLine);
                    if (nextLine.back() == ';')
                    {
                        nextLine.pop_back();
                        flag = true;
                    }
                    this->setHavingCond(nextLine);
                    if (flag)
                        break;
                }
                getline(std::cin, nextLine);
            } while (true);
        }
    }
}